

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

bool __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Generator::generate(Generator *this)

{
  Texture2DGradientTestCase *pTVar1;
  PtrData<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> data;
  int iVar2;
  Texture2D *pTVar3;
  int *piVar4;
  PixelBufferAccess *access;
  undefined1 in_stack_fffffffffffffeb8 [12];
  undefined4 in_stack_fffffffffffffec4;
  Vector<float,_4> local_104;
  Vector<float,_4> local_f4;
  undefined1 local_e4 [8];
  Vec4 gMax;
  Vector<float,_4> local_c4;
  undefined1 local_b4 [8];
  Vec4 gMin;
  deUint8 levelNdx;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  deUint8 numLevels;
  PtrData<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> local_30;
  PtrData<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *local_20;
  Generator *local_10;
  Generator *this_local;
  
  local_10 = this;
  pTVar3 = (Texture2D *)operator_new(0x50);
  pTVar1 = this->m_testCase;
  piVar4 = tcu::Vector<int,_3>::operator[](&pTVar1->m_dimensions,0);
  iVar2 = *piVar4;
  piVar4 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,1);
  tcu::Texture2D::Texture2D(pTVar3,&pTVar1->m_format,iVar2,*piVar4);
  de::DefaultDeleter<tcu::Texture2D>::DefaultDeleter
            ((DefaultDeleter<tcu::Texture2D> *)((long)fmtInfo.lookupBias.m_data + 0xb));
  de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::MovePtr();
  local_20 = de::details::MovePtr::operator_cast_to_PtrData(&local_30,(MovePtr *)pTVar3);
  data._12_4_ = in_stack_fffffffffffffec4;
  data._0_12_ = in_stack_fffffffffffffeb8;
  de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::operator=
            (&this->m_tex,data);
  de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~MovePtr
            ((MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&local_30);
  piVar4 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,0);
  iVar2 = *piVar4;
  piVar4 = tcu::Vector<int,_3>::operator[](&this->m_testCase->m_dimensions,1);
  iVar2 = de::max<int>(iVar2,*piVar4);
  iVar2 = deLog2Floor32(iVar2);
  fmtInfo.lookupBias.m_data[2]._2_1_ = (char)iVar2 + 1;
  tcu::getTextureFormatInfo((TextureFormatInfo *)(cBias.m_data + 2),&this->m_testCase->m_format);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator-((tcu *)(gMin.m_data + 3),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  for (gMin.m_data[2]._3_1_ = 0; gMin.m_data[2]._3_1_ < fmtInfo.lookupBias.m_data[2]._2_1_;
      gMin.m_data[2]._3_1_ = gMin.m_data[2]._3_1_ + 1) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),0.0,0.0,0.0,1.0);
    tcu::operator*((tcu *)&local_c4,(Vector<float,_4> *)(gMax.m_data + 2),
                   (Vector<float,_4> *)(gMin.m_data + 3));
    tcu::operator+((tcu *)local_b4,&local_c4,(Vector<float,_4> *)(cScale.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_104,1.0,1.0,1.0,0.0);
    tcu::operator*((tcu *)&local_f4,&local_104,(Vector<float,_4> *)(gMin.m_data + 3));
    tcu::operator+((tcu *)local_e4,&local_f4,(Vector<float,_4> *)(cScale.m_data + 2));
    pTVar3 = de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::
             operator->(&(this->m_tex).
                         super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>);
    tcu::Texture2D::allocLevel(pTVar3,(uint)gMin.m_data[2]._3_1_);
    pTVar3 = de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::
             operator->(&(this->m_tex).
                         super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>);
    access = tcu::TextureLevelPyramid::getLevel
                       (&pTVar3->super_TextureLevelPyramid,(uint)gMin.m_data[2]._3_1_);
    tcu::fillWithComponentGradients(access,(Vec4 *)local_b4,(Vec4 *)local_e4);
  }
  return true;
}

Assistant:

virtual bool generate (void)
	{
		m_tex = de::MovePtr<Texture2D>(new Texture2D(m_testCase->m_format,
													 m_testCase->m_dimensions[0],
													 m_testCase->m_dimensions[1]));

		const deUint8 numLevels = (deUint8) (1 + deLog2Floor32(de::max(m_testCase->m_dimensions[0],
																	   m_testCase->m_dimensions[1])));

		const TextureFormatInfo fmtInfo = getTextureFormatInfo(m_testCase->m_format);

		const Vec4 cBias  = fmtInfo.valueMin;
		const Vec4 cScale = fmtInfo.valueMax - fmtInfo.valueMin;

		for (deUint8 levelNdx = 0; levelNdx < numLevels; ++levelNdx)
		{
			const Vec4 gMin = Vec4(0.0f, 0.0f, 0.0f, 1.0f) * cScale + cBias;
			const Vec4 gMax = Vec4(1.0f, 1.0f, 1.0f, 0.0f) * cScale + cBias;

			m_tex->allocLevel(levelNdx);
			fillWithComponentGradients(m_tex->getLevel(levelNdx), gMin, gMax);
		}

		return true;
	}